

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::write_properties(Fl_Widget_Type *this)

{
  uchar uVar1;
  uchar uVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Fl_Boxtype FVar10;
  Fl_Boxtype FVar11;
  Fl_Color FVar12;
  Fl_Color FVar13;
  Fl_Labeltype FVar14;
  Fl_Labeltype FVar15;
  Fl_Font FVar16;
  Fl_Font FVar17;
  Fl_Fontsize FVar18;
  Fl_Fontsize FVar19;
  Fl_Align FVar20;
  Fl_Align FVar21;
  Fl_When FVar22;
  Fl_When FVar23;
  char *pcVar24;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float fVar25;
  double dVar26;
  double dVar27;
  char *local_128;
  uint local_94;
  uint local_90;
  int n;
  Fl_Color c;
  int s;
  Fl_Font f_2;
  Fl_Color fc;
  int fs;
  Fl_Font ff;
  Fl_Spinner *f_1;
  Fl_Spinner *v_1;
  double y;
  double x;
  Fl_Valuator *f;
  Fl_Valuator *v;
  Fl_Menu_ *b_5;
  Fl_Input_Choice *b_4;
  Fl_Button *b_3;
  Fl_Text_Display *b_2;
  Fl_Value_Input *b_1;
  Fl_Input_ *b;
  Fl_Widget *tplate;
  Fl_Widget_Type *this_local;
  
  tplate = (Fl_Widget *)this;
  Fl_Type::write_properties(&this->super_Fl_Type);
  write_indent((this->super_Fl_Type).level + 1);
  iVar9 = this->public_;
  if (iVar9 == 0) {
    write_string("private");
  }
  else if ((iVar9 != 1) && (iVar9 == 2)) {
    write_string("protected");
  }
  pcVar24 = tooltip(this);
  if ((pcVar24 != (char *)0x0) && (pcVar24 = tooltip(this), *pcVar24 != '\0')) {
    write_string("tooltip");
    pcVar24 = tooltip(this);
    write_word(pcVar24);
  }
  pcVar24 = image_name(this);
  if ((pcVar24 != (char *)0x0) && (pcVar24 = image_name(this), *pcVar24 != '\0')) {
    write_string("image");
    pcVar24 = image_name(this);
    write_word(pcVar24);
  }
  pcVar24 = inactive_name(this);
  if ((pcVar24 != (char *)0x0) && (pcVar24 = inactive_name(this), *pcVar24 != '\0')) {
    write_string("deimage");
    pcVar24 = inactive_name(this);
    write_word(pcVar24);
  }
  uVar5 = Fl_Widget::x(this->o);
  uVar6 = Fl_Widget::y(this->o);
  uVar7 = Fl_Widget::w(this->o);
  uVar8 = Fl_Widget::h(this->o);
  write_string("xywh {%d %d %d %d}",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
  b = (Fl_Input_ *)(this->super_Fl_Type).factory[1].prev;
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])();
  if (iVar9 != 0) {
    uVar1 = Fl_Spinner::type((Fl_Spinner *)this->o);
    uVar2 = Fl_Spinner::type((Fl_Spinner *)b);
    if (uVar1 != uVar2) {
      write_string("type");
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2c])();
      bVar3 = Fl_Spinner::type((Fl_Spinner *)this->o);
      pcVar24 = item_name((Fl_Menu_Item *)CONCAT44(extraout_var,iVar9),(uint)bVar3);
      write_word(pcVar24);
      goto LAB_001a1579;
    }
  }
  uVar1 = Fl_Widget::type(this->o);
  uVar2 = Fl_Widget::type(&b->super_Fl_Widget);
  if ((uVar1 != uVar2) || (iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(), iVar9 != 0)) {
    write_string("type");
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2c])();
    bVar3 = Fl_Widget::type(this->o);
    pcVar24 = item_name((Fl_Menu_Item *)CONCAT44(extraout_var_00,iVar9),(uint)bVar3);
    write_word(pcVar24);
  }
LAB_001a1579:
  FVar10 = Fl_Widget::box(this->o);
  FVar11 = Fl_Widget::box(&b->super_Fl_Widget);
  if (FVar10 != FVar11) {
    write_string("box");
    FVar10 = Fl_Widget::box(this->o);
    pcVar24 = boxname(FVar10);
    write_word(pcVar24);
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])();
  if (iVar9 != 0) {
    b_1 = (Fl_Value_Input *)this->o;
    iVar9 = Fl_Input_::shortcut((Fl_Input_ *)b_1);
    if (iVar9 != 0) {
      uVar5 = Fl_Input_::shortcut((Fl_Input_ *)b_1);
      write_string("shortcut 0x%x",(ulong)uVar5);
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])();
  if (iVar9 != 0) {
    b_2 = (Fl_Text_Display *)this->o;
    iVar9 = Fl_Value_Input::shortcut((Fl_Value_Input *)b_2);
    if (iVar9 != 0) {
      uVar5 = Fl_Value_Input::shortcut((Fl_Value_Input *)b_2);
      write_string("shortcut 0x%x",(ulong)uVar5);
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])();
  if (iVar9 != 0) {
    b_3 = (Fl_Button *)this->o;
    iVar9 = Fl_Text_Display::shortcut((Fl_Text_Display *)b_3);
    if (iVar9 != 0) {
      uVar5 = Fl_Text_Display::shortcut((Fl_Text_Display *)b_3);
      write_string("shortcut 0x%x",(ulong)uVar5);
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])();
  if (iVar9 == 0) {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])();
    iVar9 = strcmp((char *)CONCAT44(extraout_var_01,iVar9),"Fl_Input_Choice");
    if (iVar9 == 0) {
      b_5 = (Fl_Menu_ *)this->o;
      FVar10 = Fl_Input_Choice::down_box((Fl_Input_Choice *)b_5);
      if (FVar10 != FL_NO_BOX) {
        write_string("down_box");
        FVar10 = Fl_Input_Choice::down_box((Fl_Input_Choice *)b_5);
        pcVar24 = boxname(FVar10);
        write_word(pcVar24);
      }
    }
    else {
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])();
      if (iVar9 != 0) {
        v = (Fl_Valuator *)this->o;
        FVar10 = Fl_Menu_::down_box((Fl_Menu_ *)v);
        if (FVar10 != FL_NO_BOX) {
          write_string("down_box");
          FVar10 = Fl_Menu_::down_box((Fl_Menu_ *)v);
          pcVar24 = boxname(FVar10);
          write_word(pcVar24);
        }
      }
    }
  }
  else {
    b_4 = (Fl_Input_Choice *)this->o;
    FVar10 = Fl_Button::down_box((Fl_Button *)b_4);
    if (FVar10 != FL_NO_BOX) {
      write_string("down_box");
      FVar10 = Fl_Button::down_box((Fl_Button *)b_4);
      pcVar24 = boxname(FVar10);
      write_word(pcVar24);
    }
    iVar9 = Fl_Button::shortcut((Fl_Button *)b_4);
    if (iVar9 != 0) {
      uVar5 = Fl_Button::shortcut((Fl_Button *)b_4);
      write_string("shortcut 0x%x",(ulong)uVar5);
    }
    cVar4 = Fl_Button::value((Fl_Button *)b_4);
    if (cVar4 != '\0') {
      write_string("value 1");
    }
  }
  FVar12 = Fl_Widget::color(this->o);
  FVar13 = Fl_Widget::color(&b->super_Fl_Widget);
  if (FVar12 != FVar13) {
    FVar12 = Fl_Widget::color(this->o);
    write_string("color %d",(ulong)FVar12);
  }
  FVar12 = Fl_Widget::selection_color(this->o);
  FVar13 = Fl_Widget::selection_color(&b->super_Fl_Widget);
  if (FVar12 != FVar13) {
    FVar12 = Fl_Widget::selection_color(this->o);
    write_string("selection_color %d",(ulong)FVar12);
  }
  FVar14 = Fl_Widget::labeltype(this->o);
  FVar15 = Fl_Widget::labeltype(&b->super_Fl_Widget);
  if (FVar14 != FVar15) {
    write_string("labeltype");
    FVar14 = Fl_Widget::labeltype(this->o);
    pcVar24 = item_name(labeltypemenu,FVar14);
    write_word(pcVar24);
  }
  FVar16 = Fl_Widget::labelfont(this->o);
  FVar17 = Fl_Widget::labelfont(&b->super_Fl_Widget);
  if (FVar16 != FVar17) {
    uVar5 = Fl_Widget::labelfont(this->o);
    write_string("labelfont %d",(ulong)uVar5);
  }
  FVar18 = Fl_Widget::labelsize(this->o);
  FVar19 = Fl_Widget::labelsize(&b->super_Fl_Widget);
  if (FVar18 != FVar19) {
    uVar5 = Fl_Widget::labelsize(this->o);
    write_string("labelsize %d",(ulong)uVar5);
  }
  FVar12 = Fl_Widget::labelcolor(this->o);
  FVar13 = Fl_Widget::labelcolor(&b->super_Fl_Widget);
  if (FVar12 != FVar13) {
    FVar12 = Fl_Widget::labelcolor(this->o);
    write_string("labelcolor %d",(ulong)FVar12);
  }
  FVar20 = Fl_Widget::align(this->o);
  FVar21 = Fl_Widget::align(&b->super_Fl_Widget);
  if (FVar20 != FVar21) {
    FVar20 = Fl_Widget::align(this->o);
    write_string("align %d",(ulong)FVar20);
  }
  FVar22 = Fl_Widget::when(this->o);
  FVar23 = Fl_Widget::when(&b->super_Fl_Widget);
  if (FVar22 != FVar23) {
    FVar22 = Fl_Widget::when(this->o);
    write_string("when %d",(ulong)FVar22);
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
  if (iVar9 != 0) {
    f = (Fl_Valuator *)this->o;
    x = (double)b;
    dVar26 = Fl_Valuator::minimum(f);
    dVar27 = Fl_Valuator::minimum((Fl_Valuator *)x);
    if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
      Fl_Valuator::minimum(f);
      write_string("minimum %g");
    }
    dVar26 = Fl_Valuator::maximum(f);
    dVar27 = Fl_Valuator::maximum((Fl_Valuator *)x);
    if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
      Fl_Valuator::maximum(f);
      write_string("maximum %g");
    }
    dVar26 = Fl_Valuator::step(f);
    dVar27 = Fl_Valuator::step((Fl_Valuator *)x);
    if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
      Fl_Valuator::step(f);
      write_string("step %g");
    }
    dVar26 = Fl_Valuator::value(f);
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      Fl_Valuator::value(f);
      write_string("value %g");
    }
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (1 < iVar9) {
      fVar25 = Fl_Slider::slider_size((Fl_Slider *)f);
      y = (double)fVar25;
      fVar25 = Fl_Slider::slider_size((Fl_Slider *)x);
      v_1 = (Fl_Spinner *)(double)fVar25;
      if ((y != (double)v_1) || (NAN(y) || NAN((double)v_1))) {
        write_string("slider_size %g",y);
      }
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])();
  if (iVar9 != 0) {
    f_1 = (Fl_Spinner *)this->o;
    _fs = (Fl_Spinner *)b;
    dVar26 = Fl_Spinner::minimum(f_1);
    dVar27 = Fl_Spinner::minimum(_fs);
    if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
      Fl_Spinner::minimum(f_1);
      write_string("minimum %g");
    }
    dVar26 = Fl_Spinner::maximum(f_1);
    dVar27 = Fl_Spinner::maximum(_fs);
    if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
      Fl_Spinner::maximum(f_1);
      write_string("maximum %g");
    }
    dVar26 = Fl_Spinner::step(f_1);
    dVar27 = Fl_Spinner::step(_fs);
    if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
      Fl_Spinner::step(f_1);
      write_string("step %g");
    }
    dVar26 = Fl_Spinner::value(f_1);
    if ((dVar26 != 1.0) || (NAN(dVar26))) {
      Fl_Spinner::value(f_1);
      write_string("value %g");
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,4,&fc,&f_2,&s);
  if (iVar9 != 0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,0,&c,&n,&local_90);
    if (c != fc) {
      write_string("textfont %d",(ulong)c);
    }
    if (n != f_2) {
      write_string("textsize %d",(ulong)(uint)n);
    }
    if (local_90 != s) {
      write_string("textcolor %d",(ulong)local_90);
    }
  }
  uVar5 = Fl_Widget::visible(this->o);
  if (uVar5 == 0) {
    write_string("hide");
  }
  uVar5 = Fl_Widget::active(this->o);
  if (uVar5 == 0) {
    write_string("deactivate");
  }
  uVar1 = resizable(this);
  if (uVar1 != '\0') {
    write_string("resizable");
  }
  uVar1 = hotspot(this);
  if (uVar1 != '\0') {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar9 == 0) {
      local_128 = "hotspot";
    }
    else {
      local_128 = "divider";
    }
    write_string(local_128);
  }
  for (local_94 = 0; (int)local_94 < 4; local_94 = local_94 + 1) {
    pcVar24 = extra_code(this,local_94);
    if (pcVar24 != (char *)0x0) {
      write_indent((this->super_Fl_Type).level + 1);
      write_string("code%d",(ulong)local_94);
      pcVar24 = extra_code(this,local_94);
      write_word(pcVar24);
    }
  }
  pcVar24 = subclass(this);
  if (pcVar24 != (char *)0x0) {
    write_indent((this->super_Fl_Type).level + 1);
    write_string("class");
    pcVar24 = subclass(this);
    write_word(pcVar24);
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_properties() {
  Fl_Type::write_properties();
  write_indent(level+1);
  switch (public_) {
    case 0: write_string("private"); break;
    case 1: break;
    case 2: write_string("protected"); break;
  }
  if (tooltip() && *tooltip()) {
    write_string("tooltip");
    write_word(tooltip());
  }
  if (image_name() && *image_name()) {
    write_string("image");
    write_word(image_name());
  }
  if (inactive_name() && *inactive_name()) {
    write_string("deimage");
    write_word(inactive_name());
  }
  write_string("xywh {%d %d %d %d}", o->x(), o->y(), o->w(), o->h());
  Fl_Widget* tplate = ((Fl_Widget_Type*)factory)->o;
  if (is_spinner() && ((Fl_Spinner*)o)->type() != ((Fl_Spinner*)tplate)->type()) {
    write_string("type");
    write_word(item_name(subtypes(), ((Fl_Spinner*)o)->type()));
  } else if (o->type() != tplate->type() || is_window()) {
    write_string("type");
    write_word(item_name(subtypes(), o->type()));
  }
  if (o->box() != tplate->box()) {
    write_string("box"); write_word(boxname(o->box()));}
  if (is_input()) {
    Fl_Input_* b = (Fl_Input_*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_value_input()) {
    Fl_Value_Input* b = (Fl_Value_Input*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_text_display()) {
    Fl_Text_Display* b = (Fl_Text_Display*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_button()) {
    Fl_Button* b = (Fl_Button*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
    if (b->value()) write_string("value 1");
  } else if (!strcmp(type_name(), "Fl_Input_Choice")) {
    Fl_Input_Choice* b = (Fl_Input_Choice*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  } else if (is_menu_button()) {
    Fl_Menu_* b = (Fl_Menu_*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  }
  if (o->color()!=tplate->color())
    write_string("color %d", o->color());
  if (o->selection_color()!=tplate->selection_color())
    write_string("selection_color %d", o->selection_color());
  if (o->labeltype()!=tplate->labeltype()) {
    write_string("labeltype");
    write_word(item_name(labeltypemenu, o->labeltype()));
  }
  if (o->labelfont()!=tplate->labelfont())
    write_string("labelfont %d", o->labelfont());
  if (o->labelsize()!=tplate->labelsize())
    write_string("labelsize %d", o->labelsize());
  if (o->labelcolor()!=tplate->labelcolor())
    write_string("labelcolor %d", o->labelcolor());
  if (o->align()!=tplate->align())
    write_string("align %d", o->align());
  if (o->when() != tplate->when())
    write_string("when %d", o->when());
  if (is_valuator()) {
    Fl_Valuator* v = (Fl_Valuator*)o;
    Fl_Valuator* f = (Fl_Valuator*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=0.0) write_string("value %g",v->value());
    if (is_valuator()>=2) {
      double x = ((Fl_Slider*)v)->slider_size();
      double y = ((Fl_Slider*)f)->slider_size();
      if (x != y) write_string("slider_size %g", x);
    }
  }
  if (is_spinner()) {
    Fl_Spinner* v = (Fl_Spinner*)o;
    Fl_Spinner* f = (Fl_Spinner*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=1.0) write_string("value %g",v->value());
  }
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}
  if (!o->visible()) write_string("hide");
  if (!o->active()) write_string("deactivate");
  if (resizable()) write_string("resizable");
  if (hotspot()) write_string(is_menu_item() ? "divider" : "hotspot");
  for (int n=0; n < NUM_EXTRA_CODE; n++) if (extra_code(n)) {
    write_indent(level+1);
    write_string("code%d",n);
    write_word(extra_code(n));
  }
  if (subclass()) {
    write_indent(level+1);
    write_string("class");
    write_word(subclass());
  }
}